

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winsock.cpp
# Opt level: O1

string * fs_hostname_abi_cxx11_(void)

{
  int iVar1;
  size_t sVar2;
  string *in_RDI;
  string_view path;
  string_view fname;
  string_view s;
  string name;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  sVar2 = fs_get_max_path();
  local_38 = local_28;
  std::__cxx11::string::_M_construct((ulong)&local_38,(char)sVar2);
  iVar1 = gethostname((char *)local_38,local_30);
  if (iVar1 == 0) {
    s._M_str = (char *)local_38;
    s._M_len = local_30;
    fs_trim_abi_cxx11_(in_RDI,s);
  }
  else {
    path._M_str = (char *)local_38;
    path._M_len = local_30;
    fname._M_str = "fs_hostname";
    fname._M_len = 0xb;
    fs_print_error(path,fname);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string fs_hostname()
{
  std::string name(fs_get_max_path(), '\0');
  int ret = -1;

#if defined(_WIN32)
  if(WSADATA wsaData; !WSAStartup(MAKEWORD(2, 0), &wsaData)){
    ret = gethostname(name.data(), static_cast<int>(name.size()));
    WSACleanup();
  }

#else
  ret = gethostname(name.data(), name.size());
#endif

  if (ret == 0)
    return fs_trim(name);

  fs_print_error(name, __func__);
  return {};
}